

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O1

void __thiscall Diligent::InputLayoutDescX::SyncDesc(InputLayoutDescX *this,bool CopyStrings)

{
  pointer pLVar1;
  Uint32 UVar2;
  ulong uVar3;
  pointer pLVar4;
  iterator __begin3;
  pointer pLVar5;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar6;
  
  pLVar5 = (this->Elements).
           super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pLVar1 = (this->Elements).
           super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = (long)pLVar1 - (long)pLVar5;
  UVar2 = (int)(uVar3 >> 3) * -0x33333333;
  pLVar4 = (pointer)0x0;
  if (UVar2 != 0) {
    pLVar4 = pLVar5;
  }
  (this->Desc).NumElements = UVar2;
  (this->Desc).LayoutElements = pLVar4;
  if (uVar3 != 0 && CopyStrings) {
    do {
      pVar6 = std::
              _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<char_const*&>
                        ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&this->StringPool,pLVar5,pLVar4);
      pLVar4 = pVar6._8_8_;
      pLVar5->HLSLSemantic =
           *(Char **)((long)pVar6.first.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ._M_cur.
                            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                     + 8);
      pLVar5 = pLVar5 + 1;
    } while (pLVar5 != pLVar1);
  }
  return;
}

Assistant:

PipelineResourceLayoutDescX& operator=(const PipelineResourceLayoutDescX& _DescX)
    {
        PipelineResourceLayoutDescX Copy{_DescX};
        std::swap(*this, Copy);
        return *this;
    }